

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saslclientio.c
# Opt level: O0

char * get_frame_type_as_string(AMQP_VALUE descriptor)

{
  _Bool _Var1;
  char *local_18;
  char *result;
  AMQP_VALUE descriptor_local;
  
  _Var1 = is_sasl_mechanisms_type_by_descriptor(descriptor);
  if (_Var1) {
    local_18 = "[SASL MECHANISMS]";
  }
  else {
    _Var1 = is_sasl_init_type_by_descriptor(descriptor);
    if (_Var1) {
      local_18 = "[SASL INIT]";
    }
    else {
      _Var1 = is_sasl_challenge_type_by_descriptor(descriptor);
      if (_Var1) {
        local_18 = "[SASL CHALLENGE]";
      }
      else {
        _Var1 = is_sasl_response_type_by_descriptor(descriptor);
        if (_Var1) {
          local_18 = "[SASL RESPONSE]";
        }
        else {
          _Var1 = is_sasl_outcome_type_by_descriptor(descriptor);
          if (_Var1) {
            local_18 = "[SASL OUTCOME]";
          }
          else {
            local_18 = "[Unknown]";
          }
        }
      }
    }
  }
  return local_18;
}

Assistant:

static const char* get_frame_type_as_string(AMQP_VALUE descriptor)
{
    const char* result;

    if (is_sasl_mechanisms_type_by_descriptor(descriptor))
    {
        result = "[SASL MECHANISMS]";
    }
    else if (is_sasl_init_type_by_descriptor(descriptor))
    {
        result = "[SASL INIT]";
    }
    else if (is_sasl_challenge_type_by_descriptor(descriptor))
    {
        result = "[SASL CHALLENGE]";
    }
    else if (is_sasl_response_type_by_descriptor(descriptor))
    {
        result = "[SASL RESPONSE]";
    }
    else if (is_sasl_outcome_type_by_descriptor(descriptor))
    {
        result = "[SASL OUTCOME]";
    }
    else
    {
        result = "[Unknown]";
    }

    return result;
}